

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ScaleLayerParams::InternalSwap
          (ScaleLayerParams *this,ScaleLayerParams *other)

{
  bool bVar1;
  intptr_t iVar2;
  WeightParams *pWVar3;
  WeightParams *pWVar4;
  WeightParams *pWVar5;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->shapescale_,&other->shapescale_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->shapebias_,&other->shapebias_)
  ;
  pWVar3 = this->scale_;
  pWVar4 = this->bias_;
  pWVar5 = other->bias_;
  this->scale_ = other->scale_;
  this->bias_ = pWVar5;
  other->scale_ = pWVar3;
  other->bias_ = pWVar4;
  bVar1 = this->hasbias_;
  this->hasbias_ = other->hasbias_;
  other->hasbias_ = bVar1;
  return;
}

Assistant:

void ScaleLayerParams::InternalSwap(ScaleLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shapescale_.InternalSwap(&other->shapescale_);
  shapebias_.InternalSwap(&other->shapebias_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ScaleLayerParams, hasbias_)
      + sizeof(ScaleLayerParams::hasbias_)
      - PROTOBUF_FIELD_OFFSET(ScaleLayerParams, scale_)>(
          reinterpret_cast<char*>(&scale_),
          reinterpret_cast<char*>(&other->scale_));
}